

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void de::cmdline::detail::dispatchSetDefault<opt::OutValue>(TypedFieldMap *dst)

{
  OutputValue *dst_00;
  ValueType *value;
  TypedFieldMap *dst_local;
  
  dst_00 = (OutputValue *)operator_new(4);
  *dst_00 = OUTPUTVALUE_STATUS_CODE;
  getTypeDefault<OutputValue>(dst_00);
  TypedFieldMap::set<opt::OutValue>(dst,dst_00);
  return;
}

Assistant:

void dispatchSetDefault (TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		getTypeDefault<typename OptTraits<OptType>::ValueType>(value);
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}